

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O3

int run_test_gettimeofday(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_tty_t *stream;
  int64_t eval_b;
  int64_t eval_a;
  uv_timeval_t tv;
  undefined1 auStack_448 [16];
  void *pvStack_438;
  uv_tty_t uStack_430;
  uv_pipe_t uStack_318;
  sockaddr_in sStack_230;
  uv_idle_t uStack_220;
  uv_udp_t uStack_1c8;
  uv_tcp_t uStack_110;
  undefined8 uStack_38;
  uv_timeval_t local_18;
  
  local_18.tv_sec = 0;
  iVar1 = uv_gettimeofday(&local_18);
  if (iVar1 == 0) {
    if (local_18.tv_sec == 0) goto LAB_0019b5d9;
    iVar1 = uv_gettimeofday((uv_timeval_t *)0x0);
    if (iVar1 == -0x16) {
      return 0;
    }
  }
  else {
    run_test_gettimeofday_cold_1();
LAB_0019b5d9:
    run_test_gettimeofday_cold_3();
  }
  run_test_gettimeofday_cold_2();
  uStack_38 = 0;
  loop = uv_default_loop();
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&sStack_230);
  uStack_430.data = (void *)(long)iVar1;
  uStack_318.data = (void *)0x0;
  if ((uv_close_cb)uStack_430.data == (uv_close_cb)0x0) {
    iVar1 = uv_idle_init(loop,&uStack_220);
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bb92;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_220,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0xffffffffffffffea;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xffffffffffffffea) goto LAB_0019bba4;
    uv_close((uv_handle_t *)&uStack_220,(uv_close_cb)0x0);
    iVar1 = uv_tcp_init(loop,&uStack_110);
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bbb6;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_110,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bbc8;
    iVar1 = uv_tcp_bind(&uStack_110,(sockaddr *)&sStack_230,0);
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bbda;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_110,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bbec;
    uv_close((uv_handle_t *)&uStack_110,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&uStack_110,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bbfe;
    iVar1 = uv_udp_init(loop,&uStack_1c8);
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc10;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_1c8,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc22;
    iVar1 = uv_udp_bind(&uStack_1c8,(sockaddr *)&sStack_230,0);
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc34;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_1c8,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc46;
    uv_close((uv_handle_t *)&uStack_1c8,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&uStack_1c8,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    uStack_318.data = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc58;
    iVar1 = uv_pipe_init(loop,&uStack_318,0);
    uStack_430.data = (void *)(long)iVar1;
    auStack_448._0_8_ = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc6a;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_318,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    auStack_448._0_8_ = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bc79;
    iVar1 = uv_pipe_bind(&uStack_318,"/tmp/uv-test-sock");
    uStack_430.data = (void *)(long)iVar1;
    auStack_448._0_8_ = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc88;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_318,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    auStack_448._0_8_ = (void *)0x0;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0x0) goto LAB_0019bc97;
    uv_close((uv_handle_t *)&uStack_318,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&uStack_318,(uv_os_fd_t *)(auStack_448 + 0xc));
    uStack_430.data = (void *)(long)iVar1;
    auStack_448._0_8_ = (void *)0xfffffffffffffff7;
    if ((uv_close_cb)uStack_430.data != (uv_close_cb)0xfffffffffffffff7) goto LAB_0019bca6;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 == -1) {
      run_test_handle_fileno_cold_26();
LAB_0019bb1a:
      uv_run(loop,UV_RUN_DEFAULT);
      uv_walk(loop,close_walk_cb,(void *)0x0);
      uv_run(loop,UV_RUN_DEFAULT);
      auStack_448._0_8_ = (void *)0x0;
      iVar1 = uv_loop_close(loop);
      pvStack_438 = (void *)(long)iVar1;
      if ((void *)auStack_448._0_8_ == pvStack_438) {
        uv_library_shutdown();
        return 0;
      }
      goto LAB_0019bcb5;
    }
    iVar1 = uv_tty_init(loop,&uStack_430,iVar1,0);
    auStack_448._0_8_ = SEXT48(iVar1);
    pvStack_438 = (void *)0x0;
    if ((void *)auStack_448._0_8_ != (void *)0x0) goto LAB_0019bcc4;
    iVar1 = uv_is_readable((uv_stream_t *)&uStack_430);
    if (iVar1 == 0) goto LAB_0019bcd3;
    iVar1 = uv_is_writable((uv_stream_t *)&uStack_430);
    if (iVar1 != 0) goto LAB_0019bcd8;
    iVar1 = uv_fileno((uv_handle_t *)&uStack_430,(uv_os_fd_t *)(auStack_448 + 0xc));
    auStack_448._0_8_ = SEXT48(iVar1);
    pvStack_438 = (void *)0x0;
    if ((void *)auStack_448._0_8_ != (void *)0x0) goto LAB_0019bcdd;
    uv_close((uv_handle_t *)&uStack_430,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)&uStack_430,(uv_os_fd_t *)(auStack_448 + 0xc));
    auStack_448._0_8_ = SEXT48(iVar1);
    pvStack_438 = (void *)0xfffffffffffffff7;
    if ((void *)auStack_448._0_8_ != (void *)0xfffffffffffffff7) goto LAB_0019bcec;
    stream = &uStack_430;
    iVar1 = uv_is_readable((uv_stream_t *)stream);
    if (iVar1 == 0) {
      stream = &uStack_430;
      iVar1 = uv_is_writable((uv_stream_t *)stream);
      if (iVar1 != 0) goto LAB_0019bd00;
      goto LAB_0019bb1a;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0019bb92:
    run_test_handle_fileno_cold_2();
LAB_0019bba4:
    run_test_handle_fileno_cold_3();
LAB_0019bbb6:
    run_test_handle_fileno_cold_4();
LAB_0019bbc8:
    run_test_handle_fileno_cold_5();
LAB_0019bbda:
    run_test_handle_fileno_cold_6();
LAB_0019bbec:
    run_test_handle_fileno_cold_7();
LAB_0019bbfe:
    run_test_handle_fileno_cold_8();
LAB_0019bc10:
    run_test_handle_fileno_cold_9();
LAB_0019bc22:
    run_test_handle_fileno_cold_10();
LAB_0019bc34:
    run_test_handle_fileno_cold_11();
LAB_0019bc46:
    run_test_handle_fileno_cold_12();
LAB_0019bc58:
    run_test_handle_fileno_cold_13();
LAB_0019bc6a:
    run_test_handle_fileno_cold_14();
LAB_0019bc79:
    run_test_handle_fileno_cold_15();
LAB_0019bc88:
    run_test_handle_fileno_cold_16();
LAB_0019bc97:
    run_test_handle_fileno_cold_17();
LAB_0019bca6:
    run_test_handle_fileno_cold_18();
LAB_0019bcb5:
    run_test_handle_fileno_cold_27();
LAB_0019bcc4:
    run_test_handle_fileno_cold_19();
LAB_0019bcd3:
    run_test_handle_fileno_cold_25();
LAB_0019bcd8:
    run_test_handle_fileno_cold_20();
LAB_0019bcdd:
    run_test_handle_fileno_cold_21();
LAB_0019bcec:
    stream = (uv_tty_t *)auStack_448;
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0019bd00:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)stream);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)stream,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT_OK(r);
  ASSERT_NE(0, tv.tv_sec);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}